

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O2

void multikey_dynamic<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
               (uchar **strings,size_t N,size_t depth)

{
  pointer __src;
  pointer ppuVar1;
  pointer __src_00;
  pointer ppuVar2;
  byte bVar3;
  uchar uVar4;
  byte bVar5;
  size_t __n;
  size_t N_00;
  uchar **__x;
  size_t __n_00;
  ulong uVar6;
  uint j;
  long lVar7;
  uchar **__x_00;
  size_t __n_01;
  uint j_1;
  array<std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>,_3UL> buckets;
  array<unsigned_char,_32UL> cache;
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  buckets._M_elems[2].super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buckets._M_elems[2].super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets._M_elems[1].super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets._M_elems[1].super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets._M_elems[0].super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets._M_elems[1].super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buckets._M_elems[0].super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buckets._M_elems[0].super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets._M_elems[2].super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = pseudo_median<unsigned_char>(strings,N,depth);
  __x = strings;
  for (uVar6 = 0; uVar6 < (N & 0xffffffffffffffe0); uVar6 = uVar6 + 0x20) {
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
      uVar4 = get_char<unsigned_char>(__x[lVar7],depth);
      cache._M_elems[lVar7] = uVar4;
    }
    __x_00 = __x;
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                (buckets._M_elems +
                 (ulong)(cache._M_elems[lVar7] == bVar3) +
                 (ulong)(bVar3 < cache._M_elems[lVar7]) * 2,__x_00);
      __x_00 = __x_00 + 1;
    }
    __x = __x + 0x20;
  }
  for (; ppuVar2 = buckets._M_elems[2].
                   super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,
      __src_00 = buckets._M_elems[2].
                 super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
      ppuVar1 = buckets._M_elems[1].
                super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish,
      __src = buckets._M_elems[1].
              super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
              super__Vector_impl_data._M_start, uVar6 < N; uVar6 = uVar6 + 1) {
    bVar5 = get_char<unsigned_char>(*__x,depth);
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
              (buckets._M_elems +
               (ulong)(bVar5 == bVar3) + (ulong)(bVar3 <= bVar5 && bVar5 != bVar3) * 2,__x);
    __x = __x + 1;
  }
  __n_00 = (long)buckets._M_elems[0].
                 super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)buckets._M_elems[0].
                 super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  __n = (long)buckets._M_elems[1].
              super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)buckets._M_elems[1].
              super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  __n_01 = (long)buckets._M_elems[2].
                 super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)buckets._M_elems[2].
                 super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  N_00 = (long)__n_01 >> 3;
  if (((long)__n >> 3) + ((long)__n_00 >> 3) + N_00 != N) {
    __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                  ,0x5d,
                  "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = std::vector<unsigned char *>, CharT = unsigned char]"
                 );
  }
  if (buckets._M_elems[0].super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      buckets._M_elems[0].super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    memmove(strings,buckets._M_elems[0].
                    super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,__n_00);
  }
  if (ppuVar1 != __src) {
    memmove((void *)((long)strings + __n_00),__src,__n);
  }
  if (ppuVar2 != __src_00) {
    memmove((void *)((long)strings + __n + __n_00),__src_00,__n_01);
  }
  clear_bucket(buckets._M_elems);
  clear_bucket(buckets._M_elems + 1);
  clear_bucket(buckets._M_elems + 2);
  multikey_dynamic<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
            (strings,(long)__n_00 >> 3,depth);
  if (bVar3 != 0) {
    multikey_dynamic<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
              ((uchar **)((long)strings + __n_00),(long)__n >> 3,depth + 1);
  }
  multikey_dynamic<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
            ((uchar **)((long)strings + __n + __n_00),N_00,depth);
  std::array<std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>,_3UL>::~array(&buckets);
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}